

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_subexp.h
# Opt level: O0

assignable_ptr_matrix<float> * __thiscall
dlib::assignable_ptr_matrix<float>::operator=
          (assignable_ptr_matrix<float> *this,
          matrix_exp<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          *exp)

{
  bool bVar1;
  assignable_ptr_matrix<float> *in_RSI;
  assignable_ptr_matrix<float> *in_RDI;
  matrix_exp<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  *in_stack_ffffffffffffff88;
  assignable_ptr_matrix<float> *in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  matrix_exp<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  *in_stack_ffffffffffffffe8;
  
  mat<float>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = matrix_exp<dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
          ::destructively_aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                    ((matrix_exp<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                      *)in_stack_ffffffffffffff90,
                     (matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                     in_stack_ffffffffffffff88);
  if (bVar1) {
    tmp<dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (in_stack_ffffffffffffff88);
    operator=(in_RSI,in_stack_ffffffffffffffe8);
    matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    ~matrix((matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
             *)0x27f740);
  }
  else {
    matrix_assign<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

assignable_ptr_matrix& operator= (
            const matrix_exp<EXP>& exp
        ) 
        {
            // You can only assign to a set_ptrm() expression with a source matrix that
            // contains the same type of elements as the target (i.e. you can't mix double
            // and float types).
            COMPILE_TIME_ASSERT((is_same_type<T, typename EXP::type>::value == true));

            DLIB_ASSERT( exp.nr() == height && exp.nc() == width,
                "\tassignable_matrix_expression set_ptrm()"
                << "\n\tYou have tried to assign to this object using a matrix that isn't the right size"
                << "\n\texp.nr() (source matrix): " << exp.nr()
                << "\n\texp.nc() (source matrix): " << exp.nc() 
                << "\n\twidth (target matrix):    " << width
                << "\n\theight (target matrix):   " << height
                );

            if (exp.destructively_aliases(mat(ptr,height,width)) == false)
            {
                matrix_assign(*this, exp); 
            }
            else
            {
                // make a temporary copy of the matrix we are going to assign to ptr to 
                // avoid aliasing issues during the copy
                this->operator=(tmp(exp));
            }

            return *this;
        }